

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O3

Extra_UnateInfo_t * Extra_UnateInfoCreateFromZdd(DdManager *dd,DdNode *zPairs,DdNode *bSupp)

{
  int iVar1;
  Extra_UnateInfo_t *pEVar2;
  Extra_UnateVar_t *pEVar3;
  void *__ptr;
  DdNode *pDVar4;
  DdNode *n;
  uint uVar5;
  long lVar6;
  
  iVar1 = Extra_bddSuppSize(dd,bSupp);
  pEVar2 = (Extra_UnateInfo_t *)calloc(1,0x18);
  pEVar2->nVars = iVar1;
  pEVar3 = (Extra_UnateVar_t *)calloc(1,(long)iVar1 << 2);
  pEVar2->pVars = pEVar3;
  iVar1 = dd->size;
  __ptr = calloc(1,(long)iVar1 << 2);
  pEVar2->nVarsMax = iVar1;
  pDVar4 = dd->one;
  if (pDVar4 != bSupp) {
    lVar6 = 0;
    do {
      pEVar3[lVar6] =
           (Extra_UnateVar_t)((uint)pEVar3[lVar6] & 0xc0000000 | bSupp->index & 0x3fffffff);
      *(int *)((long)__ptr + (ulong)bSupp->index * 4) = (int)lVar6;
      bSupp = (bSupp->type).kids.T;
      lVar6 = lVar6 + 1;
    } while (bSupp != pDVar4);
  }
  Cudd_Ref(zPairs);
  if (dd->zero == zPairs) {
    Cudd_RecursiveDerefZdd(dd,zPairs);
    if (__ptr == (void *)0x0) {
      return pEVar2;
    }
  }
  else {
    iVar1 = 1;
    do {
      pDVar4 = Extra_zddSelectOneSubset(dd,zPairs);
      Cudd_Ref(pDVar4);
      if (((pDVar4->type).kids.T != dd->one) || ((pDVar4->type).kids.E != dd->zero)) {
        __assert_fail("cuddT(zCube) == z1 && cuddE(zCube) == z0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddUnate.c"
                      ,0x104,
                      "Extra_UnateInfo_t *Extra_UnateInfoCreateFromZdd(DdManager *, DdNode *, DdNode *)"
                     );
      }
      uVar5 = 0x80000000;
      if ((pDVar4->index & 1) == 0) {
        uVar5 = 0x40000000;
      }
      pEVar3[*(int *)((long)__ptr + (ulong)(pDVar4->index >> 1) * 4)] =
           (Extra_UnateVar_t)
           ((uint)pEVar3[*(int *)((long)__ptr + (ulong)(pDVar4->index >> 1) * 4)] | uVar5);
      pEVar2->nUnate = iVar1;
      n = Cudd_zddDiff(dd,zPairs,pDVar4);
      Cudd_Ref(n);
      Cudd_RecursiveDerefZdd(dd,zPairs);
      Cudd_RecursiveDerefZdd(dd,pDVar4);
      iVar1 = iVar1 + 1;
      zPairs = n;
    } while (n != dd->zero);
    Cudd_RecursiveDerefZdd(dd,n);
  }
  free(__ptr);
  return pEVar2;
}

Assistant:

Extra_UnateInfo_t * Extra_UnateInfoCreateFromZdd( DdManager * dd, DdNode * zPairs, DdNode * bSupp )
{
    Extra_UnateInfo_t * p;
    DdNode * bTemp, * zSet, * zCube, * zTemp;
    int * pMapVars2Nums;
    int i, nSuppSize;

    nSuppSize = Extra_bddSuppSize( dd, bSupp );

    // allocate and clean the storage for symmetry info
    p = Extra_UnateInfoAllocate( nSuppSize );

    // allocate the storage for the temporary map
    pMapVars2Nums = ABC_ALLOC( int, dd->size );
    memset( pMapVars2Nums, 0, dd->size * sizeof(int) );

    // assign the variables
    p->nVarsMax = dd->size;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
    {
        p->pVars[i].iVar = bTemp->index;
        pMapVars2Nums[bTemp->index] = i;
    }

    // write the symmetry info into the structure
    zSet = zPairs;   Cudd_Ref( zSet );
//    Cudd_zddPrintCover( dd, zPairs );    printf( "\n" );
    while ( zSet != z0 )
    {
        // get the next cube
        zCube  = Extra_zddSelectOneSubset( dd, zSet );    Cudd_Ref( zCube );

        // add this var to the data structure
        assert( cuddT(zCube) == z1 && cuddE(zCube) == z0 );
        if ( zCube->index & 1 ) // neg
            p->pVars[ pMapVars2Nums[zCube->index/2] ].Neg = 1;
        else
            p->pVars[ pMapVars2Nums[zCube->index/2] ].Pos = 1;
        // count the unate vars
        p->nUnate++;

        // update the cuver and deref the cube
        zSet = Cudd_zddDiff( dd, zTemp = zSet, zCube );     Cudd_Ref( zSet );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zCube );

    } // for each cube 
    Cudd_RecursiveDerefZdd( dd, zSet );
    ABC_FREE( pMapVars2Nums );
    return p;

}